

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

ErProc * __thiscall yactfr::internal::DsPktProc::operator[](DsPktProc *this,TypeId id)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
  local_28;
  const_iterator erProcIt;
  TypeId id_local;
  DsPktProc *this_local;
  
  erProcIt.
  super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
               )id;
  sVar2 = std::
          vector<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
          ::size(&this->_erProcsVec);
  if (id < sVar2) {
    this_00 = std::
              vector<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
              ::operator[](&this->_erProcsVec,
                           (size_type)
                           erProcIt.
                           super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
                           ._M_cur);
    this_local = (DsPktProc *)
                 std::
                 unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                 ::get(this_00);
  }
  else {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>_>
         ::find(&this->_erProcsMap,(key_type *)&erProcIt);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>_>
         ::end(&this->_erProcsMap);
    bVar1 = std::__detail::operator==(&local_28,&local_30);
    if (bVar1) {
      this_local = (DsPktProc *)0x0;
    }
    else {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false,_false>
                             *)&local_28);
      this_local = (DsPktProc *)
                   std::
                   unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                   ::get(&pvVar3->second);
    }
  }
  return (ErProc *)this_local;
}

Assistant:

const ErProc *DsPktProc::operator[](const TypeId id) const noexcept
{
    if (id < _erProcsVec.size()) {
        return _erProcsVec[id].get();
    }

    // fall back on map
    auto erProcIt = _erProcsMap.find(id);

    if (erProcIt == _erProcsMap.end()) {
        return nullptr;
    }

    return erProcIt->second.get();
}